

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regiongraph.cpp
# Opt level: O0

void __thiscall libDAI::RegionGraph::RecomputeOR(RegionGraph *this,size_t I)

{
  bool bVar1;
  size_type sVar2;
  mapped_type_conflict *pmVar3;
  pointer ppVar4;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_RSI;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *in_RDI;
  TFactor<double> *in_stack_00000008;
  TFactor<double> *in_stack_00000010;
  fac2OR_cit I_1;
  size_t alpha;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffffa8;
  RegionGraph *in_stack_ffffffffffffffb0;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffffc0;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_20;
  key_type *in_stack_ffffffffffffffe8;
  mapped_type_conflict mVar5;
  
  sVar2 = std::
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::count(in_stack_ffffffffffffffc0,(key_type *)in_RDI);
  if (sVar2 != 0) {
    pmVar3 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](in_RSI,in_stack_ffffffffffffffe8);
    mVar5 = *pmVar3;
    OR(in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8);
    TFactor<double>::fill
              ((TFactor<double> *)in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
    _Rb_tree_const_iterator(&local_20,&local_28);
    while( true ) {
      local_38._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::end(in_stack_ffffffffffffffa8);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
      _Rb_tree_const_iterator(&local_30,&local_38);
      bVar1 = std::operator!=(&local_20,&local_30);
      if (!bVar1) break;
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *
                          )in_stack_ffffffffffffffb0);
      if (ppVar4->second == mVar5) {
        in_stack_ffffffffffffffa8 =
             (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)(in_RDI + 2);
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                   in_stack_ffffffffffffffb0);
        in_stack_ffffffffffffffb0 =
             (RegionGraph *)
             FactorGraph::factor((FactorGraph *)in_stack_ffffffffffffffb0,
                                 (size_t)in_stack_ffffffffffffffa8);
        OR(in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8);
        TFactor<double>::operator*=(in_stack_00000010,in_stack_00000008);
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
                (in_RDI,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    }
  }
  return;
}

Assistant:

void RegionGraph::RecomputeOR( size_t I ) {
        if( _fac2OR.count(I) ) {
            size_t alpha = _fac2OR[I];
            OR(alpha).fill( 1.0 );
            for( fac2OR_cit I = _fac2OR.begin(); I != _fac2OR.end(); I++ )
                if( I->second == alpha )
                    OR(alpha) *= _fg.factor( I->first );
        }
    }